

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MIL.pb.cc
# Opt level: O1

void __thiscall CoreML::Specification::MILSpec::ListType::MergeFrom(ListType *this,ListType *from)

{
  void *pvVar1;
  LogMessage *other;
  ValueType *pVVar2;
  Dimension *pDVar3;
  LogFinisher local_51;
  LogMessage local_50;
  
  if (from == this) {
    google::protobuf::internal::LogMessage::LogMessage
              (&local_50,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_all_cmakelists_25/hollance[P]coremltools/build_O1/mlmodel/format/MIL.pb.cc"
               ,0x12d3);
    other = google::protobuf::internal::LogMessage::operator<<
                      (&local_50,"CHECK failed: (&from) != (this): ");
    google::protobuf::internal::LogFinisher::operator=(&local_51,other);
    google::protobuf::internal::LogMessage::~LogMessage(&local_50);
  }
  pvVar1 = (from->_internal_metadata_).
           super_InternalMetadataWithArenaBase<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::internal::InternalMetadataWithArenaLite>
           .ptr_;
  if (((ulong)pvVar1 & 1) != 0) {
    google::protobuf::internal::InternalMetadataWithArenaLite::DoMergeFrom
              (&this->_internal_metadata_,(string *)((ulong)pvVar1 & 0xfffffffffffffffe));
  }
  if ((from != (ListType *)&_ListType_default_instance_) && (from->type_ != (ValueType *)0x0)) {
    if (this->type_ == (ValueType *)0x0) {
      pVVar2 = (ValueType *)operator_new(0x20);
      ValueType::ValueType(pVVar2);
      this->type_ = pVVar2;
    }
    pVVar2 = from->type_;
    if (pVVar2 == (ValueType *)0x0) {
      pVVar2 = (ValueType *)&_ValueType_default_instance_;
    }
    ValueType::MergeFrom(this->type_,pVVar2);
  }
  if ((from != (ListType *)&_ListType_default_instance_) && (from->length_ != (Dimension *)0x0)) {
    if (this->length_ == (Dimension *)0x0) {
      pDVar3 = (Dimension *)operator_new(0x20);
      Dimension::Dimension(pDVar3);
      this->length_ = pDVar3;
    }
    pDVar3 = from->length_;
    if (pDVar3 == (Dimension *)0x0) {
      pDVar3 = (Dimension *)&_Dimension_default_instance_;
    }
    Dimension::MergeFrom(this->length_,pDVar3);
  }
  return;
}

Assistant:

void ListType::MergeFrom(const ListType& from) {
// @@protoc_insertion_point(class_specific_merge_from_start:CoreML.Specification.MILSpec.ListType)
  GOOGLE_DCHECK_NE(&from, this);
  _internal_metadata_.MergeFrom(from._internal_metadata_);
  ::google::protobuf::uint32 cached_has_bits = 0;
  (void) cached_has_bits;

  if (from.has_type()) {
    mutable_type()->::CoreML::Specification::MILSpec::ValueType::MergeFrom(from.type());
  }
  if (from.has_length()) {
    mutable_length()->::CoreML::Specification::MILSpec::Dimension::MergeFrom(from.length());
  }
}